

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall
UniformData::set(UniformData *this,UniformValue *_value,size_t _size,bool _int,bool _queue)

{
  iterator *piVar1;
  _Elt_pointer paVar2;
  undefined8 uVar3;
  undefined3 in_register_00000081;
  
  this->bInt = _int;
  this->size = _size;
  if ((CONCAT31(in_register_00000081,_queue) == 0) || (this->change != true)) {
    uVar3 = *(undefined8 *)(_value->_M_elems + 2);
    *(undefined8 *)(this->value)._M_elems = *(undefined8 *)_value->_M_elems;
    *(undefined8 *)((this->value)._M_elems + 2) = uVar3;
  }
  else {
    paVar2 = (this->queue).c.
             super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (paVar2 == (this->queue).c.
                  super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>::
      _M_push_back_aux<std::array<float,4ul>const&>
                ((deque<std::array<float,4ul>,std::allocator<std::array<float,4ul>>> *)this,_value);
    }
    else {
      uVar3 = *(undefined8 *)(_value->_M_elems + 2);
      *(undefined8 *)paVar2->_M_elems = *(undefined8 *)_value->_M_elems;
      *(undefined8 *)(paVar2->_M_elems + 2) = uVar3;
      piVar1 = &(this->queue).c.
                super__Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  this->change = true;
  return;
}

Assistant:

void UniformData::set(const UniformValue &_value, size_t _size, bool _int, bool _queue) {
    bInt = _int;
    size = _size;

    if (_queue && change)
        queue.push( _value );
    else
        value = _value;
    
    change = true;
}